

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

LY_ERR dict_insert(ly_ctx *ctx,char *value,size_t len,ly_bool zerocopy,char **str_p)

{
  uint32_t hash_00;
  LY_ERR LVar1;
  void *pvVar2;
  size_t sStack_58;
  uint32_t hash;
  ly_dict_rec rec;
  ly_dict_rec *match;
  LY_ERR ret;
  char **str_p_local;
  size_t sStack_28;
  ly_bool zerocopy_local;
  size_t len_local;
  char *value_local;
  ly_ctx *ctx_local;
  
  rec.refcount = 0;
  rec._12_4_ = 0;
  sStack_28 = len;
  len_local = (size_t)value;
  value_local = (char *)ctx;
  ly_log_dbg(1,"inserting \"%.*s\"",len & 0xffffffff,value);
  hash_00 = lyht_hash((char *)len_local,sStack_28);
  lyht_set_cb_data(*(ly_ht **)value_local,&stack0xffffffffffffffd8);
  sStack_58 = len_local;
  rec.value._0_4_ = 1;
  LVar1 = lyht_insert_with_resize_cb
                    (*(ly_ht **)value_local,&stack0xffffffffffffffa8,hash_00,lydict_resize_val_eq,
                     (void **)&rec.refcount);
  if (LVar1 == LY_EEXIST) {
    *(int *)(rec._8_8_ + 8) = *(int *)(rec._8_8_ + 8) + 1;
    if (zerocopy != '\0') {
      free((void *)len_local);
    }
  }
  else {
    if (LVar1 != LY_SUCCESS) {
      if (zerocopy != '\0') {
        free((void *)len_local);
        return LVar1;
      }
      return LVar1;
    }
    if (zerocopy == '\0') {
      pvVar2 = malloc(sStack_28 + 1);
      *(void **)rec._8_8_ = pvVar2;
      if (*(long *)rec._8_8_ == 0) {
        ly_log((ly_ctx *)value_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "dict_insert");
        return LY_EMEM;
      }
      if (sStack_28 != 0) {
        memcpy(*(void **)rec._8_8_,(void *)len_local,sStack_28);
      }
      *(undefined1 *)(*(long *)rec._8_8_ + sStack_28) = 0;
    }
  }
  *str_p = *(char **)rec._8_8_;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
dict_insert(const struct ly_ctx *ctx, char *value, size_t len, ly_bool zerocopy, const char **str_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct ly_dict_rec *match = NULL, rec;
    uint32_t hash;

    LOGDBG(LY_LDGDICT, "inserting \"%.*s\"", (int)len, value);

    hash = lyht_hash(value, len);
    /* set len as data for compare callback */
    lyht_set_cb_data(ctx->dict.hash_tab, (void *)&len);
    /* create record for lyht_insert */
    rec.value = value;
    rec.refcount = 1;

    ret = lyht_insert_with_resize_cb(ctx->dict.hash_tab, (void *)&rec, hash, lydict_resize_val_eq, (void **)&match);
    if (ret == LY_EEXIST) {
        match->refcount++;
        if (zerocopy) {
            free(value);
        }
        ret = LY_SUCCESS;
    } else if (ret == LY_SUCCESS) {
        if (!zerocopy) {
            /*
             * allocate string for new record
             * record is already inserted in hash table
             */
            match->value = malloc(sizeof *match->value * (len + 1));
            LY_CHECK_ERR_RET(!match->value, LOGMEM(ctx), LY_EMEM);
            if (len) {
                memcpy(match->value, value, len);
            }
            match->value[len] = '\0';
        }
    } else {
        /* lyht_insert returned error */
        if (zerocopy) {
            free(value);
        }
        return ret;
    }

    *str_p = match->value;

    return ret;
}